

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSS.cpp
# Opt level: O2

int __thiscall
NaPNStateSpace::verify
          (NaPNStateSpace *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  NaStateSpaceModel *pNVar1;
  uint uVar2;
  NaVector *pNVar3;
  undefined4 *puVar4;
  uint k;
  uint m;
  uint n;
  
  pNVar1 = this->m_pSSModel;
  if (pNVar1 == (NaStateSpaceModel *)0x0) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 0;
    __cxa_throw(puVar4,&NaException::typeinfo,0);
  }
  (*(pNVar1->super_NaUnit).super_NaLogging._vptr_NaLogging[0x15])(pNVar1,&k,&m,&n);
  pNVar3 = NaPetriCnOutput::data(&this->x);
  uVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
  if (uVar2 == n) {
    pNVar3 = NaPetriCnOutput::data(&this->y);
    uVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
    if (uVar2 == m) {
      pNVar3 = NaPetriCnInput::data(&this->u);
      uVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
      return CONCAT31((int3)(uVar2 >> 8),uVar2 == k);
    }
  }
  return 0;
}

Assistant:

bool
NaPNStateSpace::verify ()
{
    bool    answer = true;
    unsigned n, m, k;

    if(NULL == m_pSSModel){
      throw(na_null_pointer);
    }

    m_pSSModel->GetDimensions(k, m, n);

    answer = answer && x.data().dim() == n;
    answer = answer && y.data().dim() == m;
    answer = answer && u.data().dim() == k;

    return answer;
}